

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

void __thiscall
ncnn::Crop::resolve_crop_roi
          (Crop *this,Mat *bottom_blob,Mat *reference_blob,int *_woffset,int *_hoffset,int *_doffset
          ,int *_coffset,int *_outw,int *_outh,int *_outd,int *_outc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  if (bottom_blob->dims - 1U < 4) {
    iVar1 = bottom_blob->c;
    iVar2 = reference_blob->dims;
    iVar3 = reference_blob->w;
    iVar4 = reference_blob->h;
    iVar5 = reference_blob->c;
    switch(bottom_blob->dims) {
    case 1:
      *_woffset = this->woffset;
      *_outw = iVar3;
      return;
    case 2:
      *_woffset = this->woffset;
      *_hoffset = this->hoffset;
      *_outw = iVar3;
      *_outh = iVar4;
      return;
    case 3:
      *_woffset = this->woffset;
      *_hoffset = this->hoffset;
      *_coffset = this->coffset;
      *_outw = iVar3;
      *_outh = iVar4;
      bVar7 = iVar2 == 3;
      break;
    case 4:
      iVar6 = reference_blob->d;
      *_woffset = this->woffset;
      *_hoffset = this->hoffset;
      *_doffset = this->doffset;
      *_coffset = this->coffset;
      *_outw = iVar3;
      *_outh = iVar4;
      *_outd = iVar6;
      bVar7 = iVar2 == 4;
    }
    if (bVar7) {
      iVar1 = iVar5;
    }
    *_outc = iVar1;
    return;
  }
  return;
}

Assistant:

void Crop::resolve_crop_roi(const Mat& bottom_blob, const Mat& reference_blob, int& _woffset, int& _hoffset, int& _doffset, int& _coffset, int& _outw, int& _outh, int& _outd, int& _outc) const
{
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    int ref_w = reference_blob.w;
    int ref_h = reference_blob.h;
    int ref_d = reference_blob.d;
    int ref_channels = reference_blob.c;
    int ref_dims = reference_blob.dims;

    if (dims == 1)
    {
        _woffset = woffset;
        _outw = ref_w;
    }
    if (dims == 2)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _outw = ref_w;
        _outh = ref_h;
    }
    if (dims == 3)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _coffset = coffset;
        _outw = ref_w;
        _outh = ref_h;
        _outc = ref_dims == 3 ? ref_channels : channels;
    }
    if (dims == 4)
    {
        _woffset = woffset;
        _hoffset = hoffset;
        _doffset = doffset;
        _coffset = coffset;
        _outw = ref_w;
        _outh = ref_h;
        _outd = ref_d;
        _outc = ref_dims == 4 ? ref_channels : channels;
    }
}